

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_textlabel.cpp
# Opt level: O0

void QtMWidgets::TextLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TextFormat TVar1;
  QColor *pQVar2;
  void *_v_1;
  TextLabel *_t_1;
  undefined1 local_60 [48];
  QTextOption *local_30;
  void *_v;
  TextLabel *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (TextLabel *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == ReadProperty) {
    local_30 = (QTextOption *)*_a;
    _v = _o;
    switch(_id) {
    case 0:
      text((QString *)(local_60 + 0x18),(TextLabel *)_o);
      QString::operator=((QString *)local_30,(QString *)(local_60 + 0x18));
      QString::~QString((QString *)(local_60 + 0x18));
      break;
    case 1:
      TVar1 = textFormat((TextLabel *)_o);
      *(TextFormat *)local_30 = TVar1;
      break;
    case 2:
      textOption((TextLabel *)local_60);
      QTextOption::operator=(local_30,(QTextOption *)local_60);
      QTextOption::~QTextOption((QTextOption *)local_60);
      break;
    case 3:
      TVar1 = margin((TextLabel *)_o);
      *(TextFormat *)local_30 = TVar1;
      break;
    case 4:
      pQVar2 = color((TextLabel *)_o);
      *(undefined8 *)local_30 = *(undefined8 *)pQVar2;
      *(TextFormat *)(local_30 + 8) = *(TextFormat *)((long)&pQVar2->ct + 4);
      *(ushort *)(local_30 + 0xc) = (pQVar2->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    pQVar2 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setText((TextLabel *)_o,(QString *)pQVar2);
      break;
    case 1:
      setTextFormat((TextLabel *)_o,pQVar2->cspec);
      break;
    case 2:
      setTextOption((TextLabel *)_o,(QTextOption *)pQVar2);
      break;
    case 3:
      setMargin((TextLabel *)_o,pQVar2->cspec);
      break;
    case 4:
      setColor((TextLabel *)_o,pQVar2);
    }
  }
  return;
}

Assistant:

void QtMWidgets::TextLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<TextLabel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast< Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast< QTextOption*>(_v) = _t->textOption(); break;
        case 3: *reinterpret_cast< int*>(_v) = _t->margin(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<TextLabel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast< Qt::TextFormat*>(_v)); break;
        case 2: _t->setTextOption(*reinterpret_cast< QTextOption*>(_v)); break;
        case 3: _t->setMargin(*reinterpret_cast< int*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}